

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_uncompressed.cpp
# Opt level: O2

idx_t duckdb::UncompressedStringStorage::RemainingSpace(ColumnSegment *segment,BufferHandle *handle)

{
  __int_type _Var1;
  StringDictionaryContainer SVar2;
  idx_t iVar3;
  
  SVar2 = GetDictionary(segment,handle);
  _Var1 = (segment->super_SegmentBase<duckdb::ColumnSegment>).count.
          super___atomic_base<unsigned_long>._M_i;
  iVar3 = ColumnSegment::SegmentSize(segment);
  return (iVar3 - (((ulong)SVar2 & 0xffffffff) + _Var1 * 4)) - 8;
}

Assistant:

idx_t UncompressedStringStorage::RemainingSpace(ColumnSegment &segment, BufferHandle &handle) {
	auto dictionary = GetDictionary(segment, handle);
	D_ASSERT(dictionary.end == segment.SegmentSize());
	idx_t used_space = dictionary.size + segment.count * sizeof(int32_t) + DICTIONARY_HEADER_SIZE;
	D_ASSERT(segment.SegmentSize() >= used_space);
	return segment.SegmentSize() - used_space;
}